

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O0

ScriptBuilder * __thiscall cfd::core::ScriptBuilder::AppendData(ScriptBuilder *this,Pubkey *pubkey)

{
  iterator __first;
  iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff38;
  undefined1 local_78 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> byte_datas;
  ByteData local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *byte_array;
  Pubkey *pubkey_local;
  ScriptBuilder *this_local;
  
  byte_array = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)pubkey;
  pubkey_local = (Pubkey *)this;
  Pubkey::GetData(&local_50,pubkey);
  ByteData::GetBytes(&local_38,&local_50);
  ByteData::~ByteData((ByteData *)0x400a4d);
  local_20 = &local_38;
  WallyUtil::CreateScriptDataFromBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_78,local_20,0);
  __first = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      (in_stack_ffffffffffffff38);
  __last = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     (in_stack_ffffffffffffff38);
  __result = ::std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&this->script_byte_array_);
  ::std::
  copy<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__first._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )__last._M_current,__result);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__result.container);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__result.container);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendData(const Pubkey& pubkey) {
  const std::vector<uint8_t>& byte_array = pubkey.GetData().GetBytes();
  std::vector<uint8_t> byte_datas =
      WallyUtil::CreateScriptDataFromBytes(byte_array);
  std::copy(
      byte_datas.begin(), byte_datas.end(),
      std::back_inserter(script_byte_array_));
  return *this;
}